

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kmp_csupport.cpp
# Opt level: O2

size_t ompc_capture_affinity(char *buffer,size_t buf_size,char *format)

{
  int gtid;
  size_t sVar1;
  kmp_str_buf_t capture_buf;
  kmp_str_buf_t local_228;
  
  if (__kmp_init_middle == 0) {
    __kmp_middle_initialize();
  }
  gtid = __kmp_get_global_thread_id();
  local_228.str = local_228.bulk;
  local_228.size = 0x200;
  local_228.used = 0;
  local_228.bulk[0] = '\0';
  sVar1 = __kmp_aux_capture_affinity(gtid,format,&local_228);
  if (buf_size != 0 && buffer != (char *)0x0) {
    __kmp_strncpy_truncate(buffer,buf_size,local_228.str,(long)local_228.used + 1);
  }
  __kmp_str_buf_free(&local_228);
  return sVar1;
}

Assistant:

size_t ompc_capture_affinity(char *buffer, size_t buf_size,
                             char const *format) {
  int gtid;
  size_t num_required;
  kmp_str_buf_t capture_buf;
  if (!TCR_4(__kmp_init_middle)) {
    __kmp_middle_initialize();
  }
  gtid = __kmp_get_gtid();
  __kmp_str_buf_init(&capture_buf);
  num_required = __kmp_aux_capture_affinity(gtid, format, &capture_buf);
  if (buffer && buf_size) {
    __kmp_strncpy_truncate(buffer, buf_size, capture_buf.str,
                           capture_buf.used + 1);
  }
  __kmp_str_buf_free(&capture_buf);
  return num_required;
}